

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_block_manager.hpp
# Opt level: O3

void __thiscall
duckdb::InMemoryBlockManager::MarkBlockAsUsed(InMemoryBlockManager *this,block_id_t block_id)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot perform IO in in-memory database - MarkBlockAsUsed!","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MarkBlockAsUsed(block_id_t block_id) override {
		throw InternalException("Cannot perform IO in in-memory database - MarkBlockAsUsed!");
	}